

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_jpeg.h
# Opt level: O2

int tje_encode_to_file(char *dest_path,int width,int height,int num_components,_Bool Rgb,
                      uchar *src_data)

{
  uchar uVar1;
  int iVar2;
  uchar *src_data_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uchar *puVar6;
  uchar *puVar7;
  long lVar8;
  
  if (num_components == 1) {
    src_data_00 = (uchar *)malloc((long)(width * height * 3));
    if (src_data_00 == (uchar *)0x0) {
      iVar2 = 0;
    }
    else {
      uVar3 = 0;
      uVar5 = 0;
      if (0 < width) {
        uVar5 = (ulong)(uint)width;
      }
      uVar4 = 0;
      if (0 < height) {
        uVar4 = (ulong)(uint)height;
      }
      puVar6 = src_data_00 + 2;
      for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
        puVar7 = src_data;
        for (lVar8 = 0; uVar5 * 3 != lVar8; lVar8 = lVar8 + 3) {
          uVar1 = *puVar7;
          puVar6[lVar8] = uVar1;
          puVar6[lVar8 + -1] = uVar1;
          puVar6[lVar8 + -2] = uVar1;
          puVar7 = puVar7 + 1;
        }
        src_data = src_data + width;
        puVar6 = puVar6 + (long)width * 3;
      }
      iVar2 = tje_encode_to_file_at_quality(dest_path,3,width,height,3,Rgb,src_data_00);
      free(src_data_00);
    }
  }
  else {
    iVar2 = tje_encode_to_file_at_quality(dest_path,3,width,height,num_components,Rgb,src_data);
  }
  return iVar2;
}

Assistant:

int tje_encode_to_file(const char* dest_path,
                       const int width,
                       const int height,
                       const int num_components,
					   bool Rgb,
                       const unsigned char* src_data)
{
	if (num_components == 1)
	{
		unsigned char*  dst_data = (unsigned char*)malloc(width*height * 3);
		if (dst_data == NULL) return 0;
		for (int y = 0; y < height; y++)
		{
			const unsigned char*     inLine = src_data + (y * width);
			unsigned char*     outLine = dst_data + (y * width * 3);

			for (int x = 0; x < width; x++)
			{
				outLine[0] = outLine[1] = outLine[2] = inLine[x];

				outLine += 3;
			}
		}
		int res = tje_encode_to_file_at_quality(dest_path, 3, width, height, 3,  Rgb, dst_data);
		free(dst_data);
		return res;
	}
	else
	{ 
		int res = tje_encode_to_file_at_quality(dest_path, 3, width, height, num_components, Rgb, src_data);
		return res;
	}
}